

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_vector.cc
# Opt level: O3

void __thiscall ipx::IndexedVector::set_to_zero(IndexedVector *this)

{
  int iVar1;
  double *pdVar2;
  pointer piVar3;
  size_t sVar4;
  long lVar5;
  
  iVar1 = this->nnz_;
  if ((long)iVar1 < 0) {
    sVar4 = (this->elements_)._M_size;
  }
  else {
    sVar4 = (this->elements_)._M_size;
    if ((double)iVar1 <= (double)(int)sVar4 * 0.1) {
      if (iVar1 != 0) {
        pdVar2 = (this->elements_)._M_data;
        piVar3 = (this->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = 0;
        do {
          pdVar2[piVar3[lVar5]] = 0.0;
          lVar5 = lVar5 + 1;
        } while (iVar1 != lVar5);
      }
      goto LAB_00397e91;
    }
  }
  if (sVar4 != 0) {
    memset((this->elements_)._M_data,0,sVar4 << 3);
  }
LAB_00397e91:
  this->nnz_ = 0;
  return;
}

Assistant:

void IndexedVector::set_to_zero() {
    if (sparse()) {
        for (Int p = 0; p < nnz_; p++)
            elements_[pattern_[p]] = 0.0;
    } else {
        elements_ = 0.0;
    }
    nnz_ = 0;
}